

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

int __thiscall CVmRun::compute_diff(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  vm_datatype_t vVar1;
  uint uVar2;
  int iVar3;
  
  while( true ) {
    vVar1 = val1->typ;
    if (vVar1 != VM_INT) {
      if (vVar1 == VM_OBJ) {
        uVar2 = (val1->val).obj;
        iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ +
                            0x118))(G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),val1,uVar2,
                                    val2);
        return iVar3;
      }
      if (vVar1 == VM_LIST) {
        CVmObjList::sub_from_list
                  (val1,val1,
                   G_const_pool_X.super_CVmPoolPaged.pages_
                   [(val1->val).obj >>
                    ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                   (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (val1->val).obj),val2);
      }
      return (uint)(vVar1 == VM_LIST);
    }
    if ((val2->typ != VM_INT) && (iVar3 = vm_val_t::nonint_is_numeric(val2), iVar3 == 0)) break;
    vm_val_t::promote_int(val2,val1);
  }
  err_throw(0x7d4);
}

Assistant:

int CVmRun::compute_diff(VMG_ vm_val_t *val1, vm_val_t *val2)
{
    /* the meaning of "subtract" depends on the type of the first operand */
check_type:
    switch(val1->typ)
    {
    case VM_LIST:
        /* 
         *   list constant - remove the second value from the list, using
         *   the static list subtraction method 
         */
        CVmObjList::sub_from_list(vmg_ val1, val1,
                                  get_const_ptr(vmg_ val1->val.ofs), val2);
        return TRUE;

    case VM_OBJ:
        /* object - use the object's virtual subtraction method */
        return vm_objp(vmg_ val1->val.obj)->sub_val(
            vmg_ val1, val1->val.obj, val2);

    case VM_INT:
        /* 
         *   callers handle the int-int case inline, so we can skip that;
         *   check for other numeric types 
         */
        if (val2->is_numeric(vmg0_))
        {
            /* 
             *   the other value is numeric but not an integer; promote the
             *   integer to the other type, then re-do the type check 
             */
            val2->promote_int(vmg_ val1);
            goto check_type;
        }
        else
        {
            /* other values can't be subtracted */
            err_throw(VMERR_NUM_VAL_REQD);
            AFTER_ERR_THROW(return FALSE;)
        }

    default:
        /* other types cannot be subtracted */
        return FALSE;
    }
}